

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_nister::pollishCoefficients
               (Matrix<double,_10,_20,_0,_10,_20> *A,double *x_coeff,double *y_coeff,double *z_coeff
               )

{
  void *pvVar1;
  undefined8 *puVar2;
  ulong uVar3;
  FVectorType local_1c0;
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  local_1b0;
  undefined1 local_198 [48];
  undefined1 auStack_168 [24];
  undefined1 local_150 [40];
  undefined1 auStack_128 [24];
  Index local_110;
  undefined1 uStack_108;
  undefined7 uStack_107;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  *local_e0;
  undefined1 local_c8 [64];
  
  pvVar1 = malloc(0x58);
  if (pvVar1 != (void *)0x0) {
    uVar3 = (ulong)pvVar1 & 0xffffffffffffffc0;
    local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)(uVar3 + 0x40);
    *(void **)(uVar3 + 0x38) = pvVar1;
    local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
    *(double *)(uVar3 + 0x40) = *x_coeff;
    *(double *)(uVar3 + 0x48) = *y_coeff;
    *(double *)(uVar3 + 0x50) = *z_coeff;
    local_e0 = &local_1b0;
    local_c8 = ZEXT864(0) << 0x20;
    auStack_128 = (undefined1  [24])0x0;
    auStack_168 = local_c8._0_24_;
    local_150 = (undefined1  [40])0x0;
    local_110 = 0;
    uStack_108 = 0;
    uStack_107 = 0;
    uStack_100 = 0;
    uStack_ff = 0;
    uStack_f8 = 0;
    uStack_f7 = 0;
    uStack_f0 = 0;
    uStack_ef = 0;
    local_1b0.super_PollishCoefficientsFunctor.super_OptimizationFunctor<double,__1,__1>.m_inputs =
         3;
    local_1b0.super_PollishCoefficientsFunctor.super_OptimizationFunctor<double,__1,__1>.m_values =
         10;
    local_198._44_4_ = 0;
    local_198._32_12_ = ZEXT812(0);
    local_198._32_16_ = local_198._32_16_ << 0x20;
    local_1b0.epsfcn = 0.0;
    local_198._0_8_ = 100.0;
    local_198._16_8_ = 2.220446049250313e-06;
    local_198._24_8_ = 2.220446049250313e-06;
    local_198._8_8_ = 5;
    local_1b0.super_PollishCoefficientsFunctor._A = A;
    Eigen::
    LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
    ::minimize((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
                *)local_198,&local_1c0);
    *x_coeff = *local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
    *y_coeff = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[1];
    *z_coeff = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[2];
    Eigen::
    LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
    ::~LevenbergMarquardt
              ((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
                *)local_198);
    if (local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[-1]);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void
opengv::relative_pose::modules::fivept_nister::pollishCoefficients(
    const Eigen::Matrix<double,10,20> & A,
    double & x_coeff,
    double & y_coeff,
    double & z_coeff)
{
  const int n=3;
  VectorXd x(n);

  x[0] = x_coeff;
  x[1] = y_coeff;
  x[2] = z_coeff;

  PollishCoefficientsFunctor functor( A );
  NumericalDiff<PollishCoefficientsFunctor> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<PollishCoefficientsFunctor> >
      lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 5;
  lm.minimize(x);

  x_coeff = x[0];
  y_coeff = x[1];
  z_coeff = x[2];
}